

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Sol * earliestStart(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs
                   ,long STEPS,long THRESHOLD,long rows,long cols)

{
  pointer prVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  pointer prVar9;
  long i;
  ulong uVar10;
  value_type *__x;
  reference rVar11;
  veh v;
  vector<ride,_std::allocator<ride>_> idxset;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> vehicles;
  vector<bool,_std::allocator<bool>_> used;
  
  vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&used,(long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 6,(bool *)&vehicles,
             (allocator_type *)&v);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,(allocator_type *)&vehicles);
  vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  lVar6 = 0;
  if (vehs < 1) {
    vehs = lVar6;
  }
  for (; vehs != lVar6; lVar6 = lVar6 + 1) {
    v.avail_time = 0;
    v.loc.x = 0;
    v.loc.y = 0;
    v.id = lVar6;
    std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
              (&vehicles,&v);
  }
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 6); uVar4 = uVar4 + 1) {
    v.id = (vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data
           ._M_start)->id;
    v.avail_time = (vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                    super__Vector_impl_data._M_start)->avail_time;
    v.loc.x = ((vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                super__Vector_impl_data._M_start)->loc).x;
    v.loc.y = ((vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                super__Vector_impl_data._M_start)->loc).y;
    std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::pop
              (&vehicles);
    if (STEPS <= v.avail_time) break;
    lVar6 = 0x28;
    uVar10 = 0;
    lVar5 = 0x7fffffffffffffff;
    while( true ) {
      prVar9 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
               super__Vector_impl_data._M_start;
      prVar1 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((ulong)((long)prVar1 - (long)prVar9 >> 6) <= uVar10) break;
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,uVar10);
      if (((*rVar11._M_p & rVar11._M_mask) == 0) &&
         (lVar3 = *(long *)((long)prVar9 + lVar6 + -0x18), v.avail_time <= lVar3)) {
        lVar7 = v.loc.x - *(long *)((long)prVar9 + lVar6 + -8);
        lVar2 = -lVar7;
        if (0 < lVar7) {
          lVar2 = lVar7;
        }
        lVar8 = v.loc.y - *(long *)((long)&prVar9->id + lVar6);
        lVar7 = -lVar8;
        if (0 < lVar8) {
          lVar7 = lVar8;
        }
        lVar7 = lVar2 + v.avail_time + lVar7;
        lVar2 = *(long *)((long)prVar9 + lVar6 + -0x20);
        if (lVar7 <= lVar2) {
          lVar7 = lVar2;
        }
        if ((lVar7 < lVar5) && (*(long *)((long)prVar9 + lVar6 + -0x10) + lVar7 <= lVar3)) {
          lVar5 = lVar7;
        }
      }
      uVar10 = uVar10 + 1;
      lVar6 = lVar6 + 0x40;
    }
    idxset.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    idxset.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    idxset.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    lVar6 = 0;
    for (uVar10 = 0; uVar10 < (ulong)((long)prVar1 - (long)prVar9 >> 6); uVar10 = uVar10 + 1) {
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,uVar10);
      if (((*rVar11._M_p & rVar11._M_mask) == 0) &&
         (lVar3 = *(long *)((long)&prVar9->e_time + lVar6), v.avail_time <= lVar3)) {
        lVar7 = v.loc.x - *(long *)((long)&(prVar9->start).x + lVar6);
        lVar2 = -lVar7;
        if (0 < lVar7) {
          lVar2 = lVar7;
        }
        lVar8 = v.loc.y - *(long *)((long)&(prVar9->start).y + lVar6);
        lVar7 = -lVar8;
        if (0 < lVar8) {
          lVar7 = lVar8;
        }
        lVar7 = lVar2 + v.avail_time + lVar7;
        lVar2 = *(long *)((long)&prVar9->s_time + lVar6);
        if (lVar7 <= lVar2) {
          lVar7 = lVar2;
        }
        if ((lVar7 < lVar5 + THRESHOLD) && (lVar7 + *(long *)((long)&prVar9->len + lVar6) <= lVar3))
        {
          std::vector<ride,_std::allocator<ride>_>::push_back
                    (&idxset,(value_type *)((long)&prVar9->id + lVar6));
        }
      }
      prVar9 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
               super__Vector_impl_data._M_start;
      prVar1 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar6 = lVar6 + 0x40;
    }
    if (idxset.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        idxset.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::
      __sort<__gnu_cxx::__normal_iterator<ride*,std::vector<ride,std::allocator<ride>>>,__gnu_cxx::__ops::_Iter_comp_iter<lensort>>
                ();
      uVar10 = (idxset.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                super__Vector_impl_data._M_start)->id;
      if (((long)uVar10 < 0) ||
         (prVar9 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                   super__Vector_impl_data._M_start,
         (ulong)((long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)prVar9 >> 6) <= uVar10)) {
        __assert_fail("min_idx >= 0 && min_idx < rides.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                      ,0xc3,
                      "Sol earliestStart(const vector<ride> &, const long, const long, const long, const long, const long)"
                     );
      }
      __x = prVar9 + uVar10;
      std::vector<ride,_std::allocator<ride>_>::push_back
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + v.id,__x);
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,uVar10);
      *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
      lVar5 = v.loc.x - (__x->start).x;
      lVar6 = -lVar5;
      if (0 < lVar5) {
        lVar6 = lVar5;
      }
      lVar3 = v.loc.y - (__x->start).y;
      lVar5 = -lVar3;
      if (0 < lVar3) {
        lVar5 = lVar3;
      }
      lVar5 = lVar6 + v.avail_time + lVar5;
      if (lVar5 <= __x->s_time) {
        lVar5 = __x->s_time;
      }
      v.avail_time = lVar5 + __x->len;
      if (__x->e_time < v.avail_time) {
        __assert_fail("v.avail_time <= chosen.e_time",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                      ,0xce,
                      "Sol earliestStart(const vector<ride> &, const long, const long, const long, const long, const long)"
                     );
      }
      v.loc.x = (__x->end).x;
      v.loc.y = (__x->end).y;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                (&vehicles,&v);
    }
    std::_Vector_base<ride,_std::allocator<ride>_>::~_Vector_base
              (&idxset.super__Vector_base<ride,_std::allocator<ride>_>);
  }
  std::_Vector_base<veh,_std::allocator<veh>_>::~_Vector_base
            ((_Vector_base<veh,_std::allocator<veh>_> *)&vehicles);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&used.super__Bvector_base<std::allocator<bool>_>);
  return __return_storage_ptr__;
}

Assistant:

Sol earliestStart(const vector<ride>& rides, const long vehs, const long STEPS, const long THRESHOLD, const long rows, const long cols) {
    vector<bool> used(rides.size(), false);
    Sol sol(vehs);
    priority_queue<veh> vehicles;
    for (long i = 0; i < vehs; i++) {
        vehicles.push(veh{i, 0, pt{0, 0}});
    }

    for (long used_rides = 0; used_rides < rides.size(); used_rides++) {
        veh v = vehicles.top(); vehicles.pop();
        if (v.avail_time >= STEPS) break;

        // Find closest ride
        long min_start_time = LONG_MAX;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long start_time = max(v.avail_time + closeness, r.s_time);
            const long end_time = start_time + r.len; // max(no-wait, wait)
            if (start_time < min_start_time && end_time <= r.e_time) {
                min_start_time = start_time;
            }
        }

        vector<ride> idxset;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long start_time = max(v.avail_time + closeness, r.s_time);
            const long end_time = start_time + r.len; // max(no-wait, wait)
            if (min_start_time + THRESHOLD > start_time && end_time <= r.e_time) {
                idxset.push_back(r);
            }
        }

        // rand num between 0 and idxset.size()
        if (idxset.empty()) continue; // leave out this car
//        if (idxset.size() > 2) cerr << "IDXSET size: " << idxset.size() << endl;

        sort(idxset.begin(), idxset.end(), lensort());
        long min_idx = idxset[0].id;
        assert(min_idx >= 0 && min_idx < rides.size());

        // Update sol
        const ride& chosen = rides[min_idx];
        sol[v.id].push_back(chosen);
        used[min_idx] = true;

        // Update vehicle
        long closeness = dist(v.loc, chosen.start);
        long start_time = max(v.avail_time + closeness, chosen.s_time);
        v.avail_time = start_time + chosen.len;
        assert(v.avail_time <= chosen.e_time);
        v.loc = chosen.end;
        vehicles.push(v);
    }

    return sol;
}